

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StackBackTrace.h
# Opt level: O1

StackBackTrace *
StackBackTrace::Capture<Memory::NoThrowHeapAllocator>
          (NoThrowHeapAllocator *alloc,ULONG framesToSkip,ULONG framesToCapture)

{
  NoThrowHeapAllocator *this;
  StackBackTrace *this_00;
  undefined1 local_50 [8];
  TrackAllocData data;
  
  data.typeinfo = (type_info *)((ulong)framesToCapture * 8);
  local_50 = (undefined1  [8])&typeinfo;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_274d470;
  data.filename._0_4_ = 0x2f;
  this = Memory::NoThrowHeapAllocator::TrackAllocInfo(alloc,(TrackAllocData *)local_50);
  this_00 = (StackBackTrace *)
            Memory::NoThrowHeapAllocator::AllocZero(this,(ulong)framesToCapture * 8 + 8);
  StackBackTrace(this_00,framesToSkip,framesToCapture);
  return this_00;
}

Assistant:

StackBackTrace *
StackBackTrace::Capture(TAllocator * alloc, ULONG framesToSkip, ULONG framesToCapture)
{
    return AllocatorNewPlusZ(TAllocator, alloc, sizeof(PVOID) * framesToCapture, StackBackTrace, framesToSkip, framesToCapture);
}